

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bblif.c
# Opt level: O0

Bbl_Obj_t * Bbl_ObjFaninNext(Bbl_Obj_t *p,Bbl_Obj_t *pPrev)

{
  int iVar1;
  bool bVar2;
  Bbl_Obj_t *local_38;
  int local_24;
  Bbl_Obj_t *pBStack_20;
  int i;
  Bbl_Obj_t *pFanin;
  Bbl_Obj_t *pPrev_local;
  Bbl_Obj_t *p_local;
  
  local_24 = 0;
  while( true ) {
    bVar2 = false;
    if (local_24 < (int)(*(uint *)&p->field_0x8 >> 4)) {
      pBStack_20 = Bbl_ObjFanin(p,local_24);
      bVar2 = pBStack_20 != (Bbl_Obj_t *)0x0;
    }
    if ((!bVar2) || (pBStack_20 == pPrev)) break;
    local_24 = local_24 + 1;
  }
  iVar1 = Bbl_ObjFaninNum(p);
  if (local_24 < iVar1 + -1) {
    local_38 = Bbl_ObjFanin(p,local_24 + 1);
  }
  else {
    local_38 = (Bbl_Obj_t *)0x0;
  }
  return local_38;
}

Assistant:

Bbl_Obj_t * Bbl_ObjFaninNext( Bbl_Obj_t * p, Bbl_Obj_t * pPrev )
{
    Bbl_Obj_t * pFanin;
    int i;
    Bbl_ObjForEachFanin_int( p, pFanin, i )
        if ( pFanin == pPrev )
            break;
    return i < Bbl_ObjFaninNum(p) - 1 ? Bbl_ObjFanin( p, i+1 ) : NULL;
}